

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O2

dev_t pack_8_24(int n,unsigned_long *numbers,char **error)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (n == 2) {
    uVar1 = *numbers;
    uVar2 = numbers[1];
    uVar3 = (ulong)((uint)uVar2 & 0xffffff | (int)uVar1 << 0x18);
    if (uVar2 < 0x1000000 && (uVar1 & 0xff) == uVar1) {
      return uVar3;
    }
    pcVar4 = "invalid major number";
    if (0xffffff < uVar2) {
      pcVar4 = "invalid minor number";
    }
  }
  else {
    pcVar4 = "too many fields for format";
    uVar3 = 0;
  }
  *error = pcVar4;
  return uVar3;
}

Assistant:

static dev_t
pack_8_24(int n, unsigned long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_8_24(numbers[0], numbers[1]);
		if ((unsigned long)major_8_24(dev) != numbers[0])
			*error = iMajorError;
		if ((unsigned long)minor_8_24(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}